

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void MyDocument::DisplayContents(MyDocument *doc)

{
  bool bVar1;
  ImVec2 local_20;
  ImVec2 local_18;
  MyDocument *local_10;
  MyDocument *doc_local;
  
  local_10 = doc;
  ImGui::PushID(doc);
  ImGui::Text("Document \"%s\"",local_10->Name);
  ImGui::PushStyleColor(0,&local_10->Color);
  ImGui::TextWrapped(
                    "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
                    );
  ImGui::PopStyleColor(1);
  ImVec2::ImVec2(&local_18,100.0,0.0);
  bVar1 = ImGui::Button("Modify",&local_18);
  if (bVar1) {
    local_10->Dirty = true;
  }
  ImGui::SameLine(0.0,-1.0);
  ImVec2::ImVec2(&local_20,100.0,0.0);
  bVar1 = ImGui::Button("Save",&local_20);
  if (bVar1) {
    DoSave(local_10);
  }
  ImGui::ColorEdit3("color",&(local_10->Color).x,0);
  ImGui::PopID();
  return;
}

Assistant:

static void DisplayContents(MyDocument* doc)
    {
        ImGui::PushID(doc);
        ImGui::Text("Document \"%s\"", doc->Name);
        ImGui::PushStyleColor(ImGuiCol_Text, doc->Color);
        ImGui::TextWrapped("Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua.");
        ImGui::PopStyleColor();
        if (ImGui::Button("Modify", ImVec2(100, 0)))
            doc->Dirty = true;
        ImGui::SameLine();
        if (ImGui::Button("Save", ImVec2(100, 0)))
            doc->DoSave();
        ImGui::ColorEdit3("color", &doc->Color.x);  // Useful to test drag and drop and hold-dragged-to-open-tab behavior.
        ImGui::PopID();
    }